

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

uintm __thiscall
ParserContext::getInstructionBytes(ParserContext *this,int4 bytestart,int4 size,uint4 off)

{
  uint uVar1;
  LowlevelError *this_00;
  ulong uVar2;
  string local_40;
  
  if (0xf < bytestart + off) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Instruction is using more than 16 bytes","");
    LowlevelError::LowlevelError(this_00,&local_40);
    __cxa_throw(this_00,&BadDataError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (size < 1) {
    uVar1 = 0;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = (uint)this->buf[uVar2 + (bytestart + off)] | uVar1 << 8;
      uVar2 = uVar2 + 1;
    } while ((uint)size != uVar2);
  }
  return uVar1;
}

Assistant:

uintm ParserContext::getInstructionBytes(int4 bytestart,int4 size,uint4 off) const

{				// Get bytes from the instruction stream into a intm
				// (assuming big endian format)
  off += bytestart;
  if (off >=16)
    throw BadDataError("Instruction is using more than 16 bytes"); 
  const uint1 *ptr = buf + off;
  uintm res = 0;
  for(int4 i=0;i<size;++i) {
    res <<= 8;
    res |= ptr[i];
  }
  return res;
}